

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_taproot_util.cpp
# Opt level: O0

void __thiscall
TaprootUtil_ParseAndVerifyTapScript_Test::TestBody(TaprootUtil_ParseAndVerifyTapScript_Test *this)

{
  uint8_t tapleaf_bit;
  byte bVar1;
  bool bVar2;
  char *pcVar3;
  size_type sVar4;
  reference pvVar5;
  reference this_00;
  pointer *nodes_00;
  pointer *tapscript_00;
  string local_538;
  AssertHelper local_518;
  Message local_510;
  allocator local_501;
  string local_500;
  SchnorrPubkey local_4e0;
  bool local_4c1;
  undefined1 local_4c0 [8];
  AssertionResult gtest_ar__2;
  AssertHelper local_490;
  Message local_488;
  bool local_479;
  undefined1 local_478 [8];
  AssertionResult gtest_ar__1;
  Message local_460;
  string local_458;
  undefined1 local_438 [8];
  AssertionResult gtest_ar_8;
  Message local_420;
  size_type local_418;
  int local_40c;
  undefined1 local_408 [8];
  AssertionResult gtest_ar_7;
  Message local_3f0;
  string local_3e8;
  undefined1 local_3c8 [8];
  AssertionResult gtest_ar_6;
  Message local_3b0;
  string local_3a8;
  undefined1 local_388 [8];
  AssertionResult gtest_ar_5;
  Message local_370;
  string local_368;
  undefined1 local_348 [8];
  AssertionResult gtest_ar_4;
  Message local_330;
  size_type local_328;
  int local_31c;
  undefined1 local_318 [8];
  AssertionResult gtest_ar_3;
  Message local_300;
  string local_2f8;
  undefined1 local_2d8 [8];
  AssertionResult gtest_ar_2;
  Message local_2c0;
  undefined1 local_2b8 [8];
  AssertionResult gtest_ar_1;
  undefined1 local_2a0 [7];
  uint8_t ver;
  AssertHelper local_280;
  Message local_278;
  bool local_269;
  undefined1 local_268 [8];
  AssertionResult gtest_ar_;
  Message local_250;
  string local_248;
  undefined1 local_228 [8];
  AssertionResult gtest_ar;
  ByteData annex;
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> script_stack;
  Script tapscript;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> nodes;
  SchnorrPubkey pk;
  undefined1 local_178 [6];
  uint8_t tapleaf_flag;
  bool parity;
  SchnorrSignature sig;
  ScriptWitness local_c0;
  undefined1 local_a0 [8];
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> stack;
  allocator local_71;
  string local_70;
  undefined1 local_50 [8];
  Transaction tx2;
  TaprootUtil_ParseAndVerifyTapScript_Test *this_local;
  
  tx2.vout_.super__Vector_base<cfd::core::TxOut,_std::allocator<cfd::core::TxOut>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_70,
             "020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000"
             ,&local_71);
  cfd::core::Transaction::Transaction((Transaction *)local_50,&local_70);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  cfd::core::Transaction::GetTxIn
            ((TxInReference *)&sig.sighash_type_.is_anyone_can_pay_,(Transaction *)local_50,0);
  cfd::core::AbstractTxInReference::GetScriptWitness
            (&local_c0,(AbstractTxInReference *)&sig.sighash_type_.is_anyone_can_pay_);
  cfd::core::ScriptWitness::GetWitness
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_a0,&local_c0
            );
  cfd::core::ScriptWitness::~ScriptWitness(&local_c0);
  cfd::core::TxInReference::~TxInReference((TxInReference *)&sig.sighash_type_.is_anyone_can_pay_);
  cfd::core::SchnorrSignature::SchnorrSignature((SchnorrSignature *)local_178);
  pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._7_1_ = 0;
  pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage._6_1_ = '\0';
  cfd::core::SchnorrPubkey::SchnorrPubkey
            ((SchnorrPubkey *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &tapscript.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::Script
            ((Script *)
             &script_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &annex.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::ByteData::ByteData((ByteData *)&gtest_ar.message_);
  nodes_00 = &tapscript.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage;
  cfd::core::TaprootUtil::ParseTaprootSignData
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_a0,
             (SchnorrSignature *)local_178,
             (bool *)((long)&pk.data_.data_.
                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                             _M_impl.super__Vector_impl_data._M_end_of_storage + 7),
             (uint8_t *)
             ((long)&pk.data_.data_.
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 6),
             (SchnorrPubkey *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)nodes_00,
             (Script *)
             &script_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,
             (vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &annex.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(ByteData *)&gtest_ar.message_);
  cfd::core::SchnorrSignature::GetHex_abi_cxx11_(&local_248,(SchnorrSignature *)local_178,false);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_228,"\"\"","sig.GetHex()",(char (*) [1])0x8af3ea,&local_248);
  std::__cxx11::string::~string((string *)&local_248);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
  if (!bVar2) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_228);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x189,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
  local_269 = (bool)(~pk.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._7_1_ & 1);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_268,&local_269,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar2) {
    testing::Message::Message(&local_278);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_2a0,(internal *)local_268,(AssertionResult *)0x6e33c4,"true","false",
               (char *)nodes_00);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x18a,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    std::__cxx11::string::~string((string *)local_2a0);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  gtest_ar_1.message_.ptr_._7_1_ = 0xc0;
  testing::internal::EqHelper<false>::Compare<unsigned_char,unsigned_char>
            ((EqHelper<false> *)local_2b8,"ver","tapleaf_flag",
             (uchar *)((long)&gtest_ar_1.message_.ptr_ + 7),
             (uchar *)((long)&pk.data_.data_.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage + 6));
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2b8);
  if (!bVar2) {
    testing::Message::Message(&local_2c0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2b8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x18c,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_2c0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_2c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2b8);
  cfd::core::SchnorrPubkey::GetHex_abi_cxx11_
            (&local_2f8,
             (SchnorrPubkey *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
            ((EqHelper<false> *)local_2d8,
             "\"1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb\"","pk.GetHex()",
             (char (*) [65])0x722a65,&local_2f8);
  std::__cxx11::string::~string((string *)&local_2f8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_2d8);
  if (!bVar2) {
    testing::Message::Message(&local_300);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_2d8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x18d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_300);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_300);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_2d8);
  local_31c = 2;
  local_328 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                        ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         &tapscript.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_318,"2","nodes.size()",&local_31c,&local_328);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_318);
  if (!bVar2) {
    testing::Message::Message(&local_330);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_318);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_4.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x18e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_4.message_,&local_330);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_4.message_);
    testing::Message::~Message(&local_330);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_318);
  sVar4 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::size
                    ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                     &tapscript.script_stack_.
                      super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar4 == 2) {
    pvVar5 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
             operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        &tapscript.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,0);
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_368,pvVar5);
    testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
              ((EqHelper<false> *)local_348,
               "\"4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d\"",
               "nodes[0].GetHex()",(char (*) [65])0x6e89dc,&local_368);
    std::__cxx11::string::~string((string *)&local_368);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_348);
    if (!bVar2) {
      testing::Message::Message(&local_370);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_348);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
                 ,0x191,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_370);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
      testing::Message::~Message(&local_370);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_348);
    pvVar5 = std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::
             operator[]((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                        &tapscript.script_stack_.
                         super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage,1);
    cfd::core::ByteData256::GetHex_abi_cxx11_(&local_3a8,pvVar5);
    testing::internal::EqHelper<false>::Compare<char[65],std::__cxx11::string>
              ((EqHelper<false> *)local_388,
               "\"dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54\"",
               "nodes[1].GetHex()",(char (*) [65])0x6e8a1f,&local_3a8);
    std::__cxx11::string::~string((string *)&local_3a8);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_388);
    if (!bVar2) {
      testing::Message::Message(&local_3b0);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_388);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
                 ,0x193,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_6.message_,&local_3b0);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
      testing::Message::~Message(&local_3b0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_388);
  }
  cfd::core::Script::GetHex_abi_cxx11_
            (&local_3e8,
             (Script *)
             &script_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<char[69],std::__cxx11::string>
            ((EqHelper<false> *)local_3c8,
             "\"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac\"",
             "tapscript.GetHex()",
             (char (*) [69])"201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
             &local_3e8);
  std::__cxx11::string::~string((string *)&local_3e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3c8);
  if (!bVar2) {
    testing::Message::Message(&local_3f0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_3c8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x196,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_3f0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_3f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_3c8);
  local_40c = 1;
  local_418 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &annex.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
  testing::internal::EqHelper<false>::Compare<int,unsigned_long>
            ((EqHelper<false> *)local_408,"1","script_stack.size()",&local_40c,&local_418);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_408);
  if (!bVar2) {
    testing::Message::Message(&local_420);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_408);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_8.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x197,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_8.message_,&local_420);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_8.message_);
    testing::Message::~Message(&local_420);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_408);
  sVar4 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::size
                    ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                     &annex.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
  if (sVar4 == 1) {
    this_00 = std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::operator[]
                        ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
                         &annex.data_.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage,0);
    cfd::core::ByteData::GetHex_abi_cxx11_(&local_458,this_00);
    testing::internal::EqHelper<false>::Compare<char[131],std::__cxx11::string>
              ((EqHelper<false> *)local_438,
               "\"f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee901\""
               ,"script_stack[0].GetHex()",
               (char (*) [131])
               "f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee901"
               ,&local_458);
    std::__cxx11::string::~string((string *)&local_458);
    bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_438);
    if (!bVar2) {
      testing::Message::Message(&local_460);
      pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_438);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar__1.message_,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
                 ,0x19b,pcVar3);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar__1.message_,&local_460);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar__1.message_);
      testing::Message::~Message(&local_460);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_438);
  }
  local_479 = cfd::core::ByteData::IsEmpty((ByteData *)&gtest_ar.message_);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_478,&local_479,(type *)0x0);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_478);
  if (!bVar2) {
    testing::Message::Message(&local_488);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&gtest_ar__2.message_,(internal *)local_478,
               (AssertionResult *)"annex.IsEmpty()","false","true",(char *)nodes_00);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_490,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x19d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_490,&local_488);
    testing::internal::AssertHelper::~AssertHelper(&local_490);
    std::__cxx11::string::~string((string *)&gtest_ar__2.message_);
    testing::Message::~Message(&local_488);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_478);
  bVar1 = pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._7_1_;
  tapleaf_bit = pk.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_end_of_storage._6_1_;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_500,"3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2"
             ,&local_501);
  cfd::core::SchnorrPubkey::SchnorrPubkey(&local_4e0,&local_500);
  tapscript_00 = &script_stack.
                  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage;
  local_4c1 = cfd::core::TaprootUtil::VerifyTaprootCommitment
                        ((bool)(bVar1 & 1),tapleaf_bit,&local_4e0,
                         (SchnorrPubkey *)
                         &nodes.
                          super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,
                         (vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
                         &tapscript.script_stack_.
                          super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,(Script *)tapscript_00,
                         (ByteData256 *)0x0,kMainnet);
  testing::AssertionResult::AssertionResult<bool>
            ((AssertionResult *)local_4c0,&local_4c1,(type *)0x0);
  cfd::core::SchnorrPubkey::~SchnorrPubkey(&local_4e0);
  std::__cxx11::string::~string((string *)&local_500);
  std::allocator<char>::~allocator((allocator<char> *)&local_501);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4c0);
  if (!bVar2) {
    testing::Message::Message(&local_510);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_538,(internal *)local_4c0,
               (AssertionResult *)
               "TaprootUtil::VerifyTaprootCommitment( parity, tapleaf_flag, SchnorrPubkey(\"3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2\"), pk, nodes, tapscript)"
               ,"false","true",(char *)tapscript_00);
    pcVar3 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_518,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/cryptogarageinc[P]cfd-go/external/cfd-core/test/test_taproot_util.cpp"
               ,0x1a2,pcVar3);
    testing::internal::AssertHelper::operator=(&local_518,&local_510);
    testing::internal::AssertHelper::~AssertHelper(&local_518);
    std::__cxx11::string::~string((string *)&local_538);
    testing::Message::~Message(&local_510);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4c0);
  cfd::core::ByteData::~ByteData((ByteData *)&gtest_ar.message_);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)
             &annex.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  cfd::core::Script::~Script
            ((Script *)
             &script_stack.
              super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
            ((vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> *)
             &tapscript.script_stack_.
              super__Vector_base<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrPubkey::~SchnorrPubkey
            ((SchnorrPubkey *)
             &nodes.
              super__Vector_base<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  cfd::core::SchnorrSignature::~SchnorrSignature((SchnorrSignature *)local_178);
  std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::~vector
            ((vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *)local_a0);
  cfd::core::Transaction::~Transaction((Transaction *)local_50);
  return;
}

Assistant:

TEST(TaprootUtil, ParseAndVerifyTapScript) {
  Transaction tx2("020000000001015b80a1af0e00c700bee9c8e4442bec933fcdc0c686dac2dc336caaaf186c5d190000000000ffffffff0130f1029500000000160014164e985d0fc92c927a66c0cbaf78e6ea389629d50341f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee90122201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac61c01777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6ddc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d5400000000");
  auto stack = tx2.GetTxIn(0).GetScriptWitness().GetWitness();
  SchnorrSignature sig;
  bool parity = false;
  uint8_t tapleaf_flag = 0;
  SchnorrPubkey pk;
  std::vector<ByteData256> nodes;
  Script tapscript;
  std::vector<ByteData> script_stack;
  ByteData annex;
  TaprootUtil::ParseTaprootSignData(stack, &sig, &parity, &tapleaf_flag,
      &pk, &nodes, &tapscript, &script_stack, &annex);
  EXPECT_EQ("", sig.GetHex());
  EXPECT_FALSE(parity);
  uint8_t ver = TaprootScriptTree::kTapScriptLeafVersion;
  EXPECT_EQ(ver, tapleaf_flag);
  EXPECT_EQ("1777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfb", pk.GetHex());
  EXPECT_EQ(2, nodes.size());
  if (nodes.size() == 2) {
    EXPECT_EQ("4d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d",
        nodes[0].GetHex());
    EXPECT_EQ("dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54",
        nodes[1].GetHex());
  }
  EXPECT_EQ("201777701648fa4dd93c74edd9d58cfcc7bdc2fa30a2f6fa908b6fd70c92833cfbac",
      tapscript.GetHex());
  EXPECT_EQ(1, script_stack.size());
  if (script_stack.size() == 1) {
    EXPECT_EQ(
        "f5aa6b260f9df687786cd3813ba83b476e195041bccea800f2571212f4aae9848a538b6175a4f8ea291d38e351ea7f612a3d700dca63cd3aff05d315c5698ee901",
        script_stack[0].GetHex());
  }
  EXPECT_TRUE(annex.IsEmpty());

  EXPECT_TRUE(TaprootUtil::VerifyTaprootCommitment(
      parity, tapleaf_flag,
      SchnorrPubkey("3dee5a5387a2b57902f3a6e9da077726d19c6cc8c8c7b04bcf5a197b2a9b01d2"),
      pk, nodes, tapscript));
}